

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O3

int main(void)

{
  codeTest();
  ansiTest();
  iteratorTest();
  exoticTest();
  return 0;
}

Assistant:

int main()
{
#ifdef _WIN32
	try
	{
		enable_vterm_processing();
	}
	catch (...)
	{
		std::cout << "Failed to enable virtual terminal command processing; is "
					 "this a Linux terminal emulator?"
				  << std::endl;
	}

#endif

	codeTest();
	ansiTest();
	iteratorTest();
	exoticTest();

	return 0;
}